

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

double __thiscall VCClusterAniso::energy(VCClusterAniso *this)

{
  double dVar1;
  Vector3d zi;
  double local_28;
  double dStack_20;
  double local_18;
  
  (*(this->super_VCCluster)._vptr_VCCluster[7])(&local_28,this);
  dVar1 = (this->sumKPos).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1] * dStack_20 +
          local_18 *
          (this->sumKPos).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] +
          (this->sumKPos).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] * local_28;
  return ((local_18 *
           (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7] +
          (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
          .array[4] * dStack_20 +
          local_28 *
          (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
          .array[1]) * dStack_20 +
          ((this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[8] * local_18 +
          (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
          .array[5] * dStack_20 +
          (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
          .array[2] * local_28) * local_18 +
         (local_18 *
          (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
          .array[6] +
         (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] * dStack_20 +
         local_28 *
         (this->sumK).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0]) * local_28) - (dVar1 + dVar1);
}

Assistant:

double VCClusterAniso::energy() {
	Vector3d zi = center();
	return zi.dot(sumK * zi) - 2 * zi.dot(sumKPos);
}